

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void dw3_female_merchant(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x80,0x1b,0x3b,0x77,0x6f,0x5f,0x5f,0x1f,0xf,0x1b,0x37,0x6e,0x7f,0x5f,0x5a,0x12,
         8,0xc0,0xf0,0xf0,0xf8,0xf8,0xf8,0xf0,0xe0,0xc0,0xf0,0xf0,0x78,0x7a,0x5a,0x42,2,0x16,0x77,
         0x7e,0x1f,0x1c,1,6,0,0xf,0xe,0x19,0,3,0xf,6,0,0x6f,0xee,0x76,0xe0,0,0,0,0xf0,0xb7,0x70,0xf0
         ,0,0xf0,0xf0,0xe0,0xf0,0x1b,0x3b);
  vpatch(rom,0x12400,0x180,3,0xf,0x1f,0x1f,0xf,0xf,0xf,7,3,0xf,0x1b,0x17,0x17,0x14,0x14,0x10,0xc0,
         0xd8,0xec,0xee,0xf6,0xf6,0xf4,0xe0,0xc0,0xe8,0xf4,0xfe,0xf6,0xf6,0x34,0x60,0x3c,0x1f,0x1f,3
         ,0,0,0,7,0x3f,4,1,0,7,7,3,7,0,0xe0,0xf0,0xe0,0,8,0x10,0xc0,0xe0,0xf0,0xf0,0,0xf0,0xf8,0xd0,
         0xc0,3,0xf);
  return;
}

Assistant:

static void dw3_female_merchant(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  128,  0x1b,  0x3b,  0x77,  0x6f,  0x5f,  0x5f,  0x1f,  0x0f,  0x1b,  0x37,  0x6e,  0x7f,  0x5f,  0x5a,  0x12,  0x08,  0xc0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0xe0,  0xc0,  0xf0,  0xf0,  0x78,  0x7a,  0x5a,  0x42,  0x02,  0x16,  0x77,  0x7e,  0x1f,  0x1c,  0x01,  0x06,  0x00,  0x0f,  0x0e,  0x19,  0x00,  0x03,  0x0f,  0x06,  0x00,  0x6f,  0xee,  0x76,  0xe0,  0x00,  0x00,  0x00,  0xf0,  0xb7,  0x70,  0xf0,  0x00,  0xf0,  0xf0,  0xe0,  0xf0,  0x1b,  0x3b,  0x77,  0x6f,  0x5f,  0x5f,  0x1f,  0x0f,  0x1b,  0x37,  0x6e,  0x7f,  0x5f,  0x5a,  0x12,  0x08,  0xc0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0xe0,  0xc0,  0xf0,  0xf0,  0x78,  0x78,  0x5c,  0x44,  0x04,  0x66,  0x77,  0x1e,  0x1f,  0x1c,  0x00,  0x00,  0x0f,  0x0f,  0x0e,  0x19,  0x00,  0x03,  0x0f,  0x07,  0x0f,  0x68,  0xee,  0x7c,  0xec,  0x00,  0x80,  0x60,  0x00,  0xb4,  0x7e,  0xf0,  0x00,  0xf0,  0xf0,  0x60,  0x00);
    vpatch(rom, 0x12400,  384,  0x03,  0x0f,  0x1f,  0x1f,  0x0f,  0x0f,  0x0f,  0x07,  0x03,  0x0f,  0x1b,  0x17,  0x17,  0x14,  0x14,  0x10,  0xc0,  0xd8,  0xec,  0xee,  0xf6,  0xf6,  0xf4,  0xe0,  0xc0,  0xe8,  0xf4,  0xfe,  0xf6,  0xf6,  0x34,  0x60,  0x3c,  0x1f,  0x1f,  0x03,  0x00,  0x00,  0x00,  0x07,  0x3f,  0x04,  0x01,  0x00,  0x07,  0x07,  0x03,  0x07,  0x00,  0xe0,  0xf0,  0xe0,  0x00,  0x08,  0x10,  0xc0,  0xe0,  0xf0,  0xf0,  0x00,  0xf0,  0xf8,  0xd0,  0xc0,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x0f,  0x0f,  0x07,  0x03,  0x0f,  0x1b,  0x17,  0x17,  0x24,  0x24,  0x20,  0xc0,  0xd8,  0xec,  0xee,  0xf6,  0xf6,  0xf4,  0xe0,  0xc0,  0xe8,  0xf4,  0xfe,  0xf6,  0xf6,  0x34,  0x60,  0x04,  0x7f,  0x3f,  0x37,  0x00,  0x00,  0x0e,  0x00,  0x27,  0x71,  0x03,  0x00,  0x07,  0x07,  0x0e,  0x00,  0x18,  0xd8,  0xe0,  0xe0,  0x00,  0x00,  0x18,  0xf0,  0xc0,  0xe0,  0xe0,  0x00,  0xf0,  0xf0,  0xf8,  0xf0,  0x03,  0x1b,  0x37,  0x77,  0x6f,  0x6f,  0x2f,  0x07,  0x03,  0x17,  0x2f,  0x7f,  0x6f,  0x6f,  0x2c,  0x06,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0xf0,  0xe0,  0xc0,  0xf0,  0xd8,  0xe8,  0xe8,  0x28,  0x28,  0x08,  0x00,  0x07,  0x0f,  0x07,  0x01,  0x10,  0x08,  0x03,  0x07,  0x0c,  0x0e,  0x00,  0x0e,  0x1f,  0x0b,  0x03,  0x3c,  0xd8,  0xf8,  0xc0,  0xc0,  0x00,  0x00,  0xe0,  0xec,  0xe0,  0x40,  0x00,  0x20,  0xe0,  0xc0,  0xe0,  0x03,  0x1b,  0x37,  0x77,  0x6f,  0x6f,  0x2f,  0x07,  0x03,  0x17,  0x2f,  0x7f,  0x6f,  0x6f,  0x2c,  0x06,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0xf0,  0xe0,  0xc0,  0xf0,  0xd8,  0xe8,  0xe8,  0x24,  0x24,  0x04,  0x00,  0x07,  0x0f,  0x07,  0x01,  0x00,  0x18,  0x0f,  0x07,  0x0c,  0x09,  0x00,  0x0e,  0x0f,  0x1f,  0x0f,  0x20,  0xde,  0xfc,  0xec,  0xc0,  0x00,  0x70,  0x00,  0xe4,  0xee,  0xc0,  0x00,  0x20,  0xe0,  0x70,  0x00,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x0f,  0x07,  0x03,  0x0f,  0x0f,  0x1f,  0x5f,  0x5f,  0x4f,  0x47,  0xd8,  0xbc,  0x7e,  0xbe,  0xfe,  0xfc,  0xfc,  0xe0,  0xd8,  0xdc,  0xbe,  0xde,  0xee,  0xec,  0xf4,  0xe0,  0xf9,  0x76,  0x6f,  0x07,  0x0e,  0x0f,  0x06,  0x00,  0xe6,  0x0f,  0x0f,  0x00,  0x0f,  0x0f,  0x06,  0x00,  0x90,  0x68,  0xfc,  0xfc,  0x18,  0x00,  0x00,  0xf0,  0x60,  0xf0,  0xf0,  0x00,  0xe0,  0xf0,  0xe0,  0xf0,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x0f,  0x07,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x3f,  0x2f,  0x27,  0xd8,  0xbc,  0x7e,  0xbe,  0xfe,  0xfc,  0xfc,  0xe0,  0xd8,  0xdc,  0xbe,  0xde,  0xee,  0xec,  0xf4,  0xe0,  0x09,  0x76,  0x3f,  0x37,  0x00,  0x00,  0x00,  0x0f,  0x26,  0x6f,  0x0f,  0x00,  0x0f,  0x0f,  0x07,  0x0f,  0x98,  0x6e,  0xf6,  0xf8,  0x78,  0xf0,  0x60,  0x00,  0x60,  0xf0,  0xf0,  0x00,  0xf0,  0xf0,  0x60,  0x00);
}